

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalIEJoin::GetData
          (PhysicalIEJoin *this,ExecutionContext *context,DataChunk *result,
          OperatorSourceInput *input)

{
  DataChunk *this_00;
  IEJoinGlobalSourceState *this_01;
  IEJoinLocalSourceState *lstate;
  _Head_base<0UL,_duckdb::IEJoinUnion_*,_false> _Var1;
  pointer pLVar2;
  pointer pLVar3;
  bool *pbVar4;
  ulong uVar5;
  sel_t *psVar6;
  pointer pGVar7;
  const_reference pvVar8;
  reference pvVar9;
  pointer pGVar10;
  reference pvVar11;
  ulong left_cols;
  ulong uVar12;
  ClientContext *client;
  idx_t iVar13;
  ClientContext *unaff_R15;
  size_type __n;
  BufferHandle local_60;
  BufferHandle local_48;
  
  client = (ClientContext *)context;
  pGVar7 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  this_01 = (IEJoinGlobalSourceState *)input->global_state;
  lstate = (IEJoinLocalSourceState *)input->local_state;
  IEJoinGlobalSourceState::Initialize(this_01);
  if ((((lstate->joiner).
        super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
        super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
        super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl == (IEJoinUnion *)0x0) &&
      (lstate->left_matches == (bool *)0x0)) && (lstate->right_matches == (bool *)0x0)) {
    client = context->client;
    IEJoinGlobalSourceState::GetNextPair(this_01,client,lstate);
  }
  _Var1._M_head_impl =
       (lstate->joiner).
       super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
       super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
       super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl;
  while (_Var1._M_head_impl != (IEJoinUnion *)0x0) {
    ResolveComplexJoin(this,(ExecutionContext *)client,result,(LocalSourceState *)lstate);
    if (result->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
    unaff_R15 = context->client;
    ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::reset
              ((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
               &lstate->joiner,(pointer)0x0);
    LOCK();
    (this_01->completed).super___atomic_base<unsigned_long>._M_i =
         (this_01->completed).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    client = unaff_R15;
    IEJoinGlobalSourceState::GetNextPair(this_01,unaff_R15,lstate);
    _Var1._M_head_impl =
         (lstate->joiner).
         super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
         super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
         super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl;
  }
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       children,0);
  pLVar2 = (pvVar8->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (pvVar8->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  left_cols = ((long)pLVar3 - (long)pLVar2 >> 3) * -0x5555555555555555;
  this_00 = &lstate->unprojected;
  while (pbVar4 = lstate->left_matches, pbVar4 != (bool *)0x0) {
    uVar12 = lstate->outer_idx;
    uVar5 = lstate->outer_count;
    if (uVar12 < uVar5) {
      psVar6 = (lstate->true_sel).sel_vector;
      iVar13 = 0;
      do {
        if (pbVar4[uVar12] == false) {
          psVar6[iVar13] = (sel_t)uVar12;
          iVar13 = iVar13 + 1;
          if (0x7ff < iVar13) {
            lstate->outer_idx = uVar12 + 1;
            break;
          }
        }
        uVar12 = uVar12 + 1;
        lstate->outer_idx = uVar12;
      } while (uVar5 != uVar12);
    }
    else {
      iVar13 = 0;
    }
    if (iVar13 == 0) {
      IEJoinGlobalSourceState::GetNextPair(this_01,context->client,lstate);
    }
    else {
      DataChunk::Reset(this_00);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                             *)(pGVar7 + 1),0);
      pGVar10 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->(pvVar9);
      PhysicalRangeJoin::SliceSortedPayload
                (&local_48,this_00,&pGVar10->global_sort_state,lstate->left_block_index,
                 &lstate->true_sel,iVar13,0);
      BufferHandle::~BufferHandle(&local_48);
      uVar12 = left_cols;
      if (left_cols <
          (ulong)(((long)(lstate->unprojected).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(lstate->unprojected).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)) {
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar12);
          Vector::SetVectorType(pvVar11,CONSTANT_VECTOR);
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar12);
          ConstantVector::SetNull(pvVar11,true);
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(((long)(lstate->unprojected).data.
                                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         .
                                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(lstate->unprojected).data.
                                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         .
                                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x4ec4ec4ec4ec4ec5));
      }
      PhysicalRangeJoin::ProjectResult(&this->super_PhysicalRangeJoin,this_00,result);
      result->count = iVar13;
      DataChunk::Verify(result);
      unaff_R15 = (ClientContext *)(ulong)(result->count == 0);
    }
    if (iVar13 != 0) {
      return (SourceResultType)unaff_R15;
    }
  }
  do {
    pbVar4 = lstate->right_matches;
    if (pbVar4 == (bool *)0x0) break;
    uVar12 = lstate->outer_idx;
    uVar5 = lstate->outer_count;
    if (uVar12 < uVar5) {
      psVar6 = (lstate->true_sel).sel_vector;
      iVar13 = 0;
      do {
        if (pbVar4[uVar12] == false) {
          psVar6[iVar13] = (sel_t)uVar12;
          iVar13 = iVar13 + 1;
          if (0x7ff < iVar13) {
            lstate->outer_idx = uVar12 + 1;
            break;
          }
        }
        uVar12 = uVar12 + 1;
        lstate->outer_idx = uVar12;
      } while (uVar5 != uVar12);
    }
    else {
      iVar13 = 0;
    }
    if (iVar13 == 0) {
      IEJoinGlobalSourceState::GetNextPair(this_01,context->client,lstate);
    }
    else {
      DataChunk::Reset(this_00);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                             *)(pGVar7 + 1),1);
      pGVar10 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->(pvVar9);
      PhysicalRangeJoin::SliceSortedPayload
                (&local_60,this_00,&pGVar10->global_sort_state,lstate->right_block_index,
                 &lstate->true_sel,iVar13,left_cols);
      BufferHandle::~BufferHandle(&local_60);
      if (pLVar3 != pLVar2) {
        __n = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
          Vector::SetVectorType(pvVar11,CONSTANT_VECTOR);
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
          ConstantVector::SetNull(pvVar11,true);
          __n = __n + 1;
        } while (left_cols + (left_cols == 0) != __n);
      }
      PhysicalRangeJoin::ProjectResult(&this->super_PhysicalRangeJoin,this_00,result);
      result->count = iVar13;
      DataChunk::Verify(result);
    }
  } while (iVar13 == 0);
  return result->count == 0;
}

Assistant:

SourceResultType PhysicalIEJoin::GetData(ExecutionContext &context, DataChunk &result,
                                         OperatorSourceInput &input) const {
	auto &ie_sink = sink_state->Cast<IEJoinGlobalState>();
	auto &ie_gstate = input.global_state.Cast<IEJoinGlobalSourceState>();
	auto &ie_lstate = input.local_state.Cast<IEJoinLocalSourceState>();

	ie_gstate.Initialize();

	if (!ie_lstate.joiner && !ie_lstate.left_matches && !ie_lstate.right_matches) {
		ie_gstate.GetNextPair(context.client, ie_lstate);
	}

	// Process INNER results
	while (ie_lstate.joiner) {
		ResolveComplexJoin(context, result, ie_lstate);

		if (result.size()) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		}

		ie_gstate.PairCompleted(context.client, ie_lstate);
	}

	// Process LEFT OUTER results
	const auto left_cols = children[0].get().GetTypes().size();
	while (ie_lstate.left_matches) {
		const idx_t count = ie_lstate.SelectOuterRows(ie_lstate.left_matches);
		if (!count) {
			ie_gstate.GetNextPair(context.client, ie_lstate);
			continue;
		}
		auto &chunk = ie_lstate.unprojected;
		chunk.Reset();
		SliceSortedPayload(chunk, ie_sink.tables[0]->global_sort_state, ie_lstate.left_block_index, ie_lstate.true_sel,
		                   count);

		// Fill in NULLs to the right
		for (auto col_idx = left_cols; col_idx < chunk.ColumnCount(); ++col_idx) {
			chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(chunk.data[col_idx], true);
		}

		ProjectResult(chunk, result);
		result.SetCardinality(count);
		result.Verify();

		return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
	}

	// Process RIGHT OUTER results
	while (ie_lstate.right_matches) {
		const idx_t count = ie_lstate.SelectOuterRows(ie_lstate.right_matches);
		if (!count) {
			ie_gstate.GetNextPair(context.client, ie_lstate);
			continue;
		}

		auto &chunk = ie_lstate.unprojected;
		chunk.Reset();
		SliceSortedPayload(chunk, ie_sink.tables[1]->global_sort_state, ie_lstate.right_block_index, ie_lstate.true_sel,
		                   count, left_cols);

		// Fill in NULLs to the left
		for (idx_t col_idx = 0; col_idx < left_cols; ++col_idx) {
			chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(chunk.data[col_idx], true);
		}

		ProjectResult(chunk, result);
		result.SetCardinality(count);
		result.Verify();

		break;
	}

	return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}